

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O2

void __thiscall
TPZManVector<MaterialDataV,_10>::~TPZManVector(TPZManVector<MaterialDataV,_10> *this)

{
  long lVar1;
  
  (this->super_TPZVec<MaterialDataV>)._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01816098;
  if ((this->super_TPZVec<MaterialDataV>).fStore == this->fExtAlloc) {
    (this->super_TPZVec<MaterialDataV>).fStore = (MaterialDataV *)0x0;
  }
  (this->super_TPZVec<MaterialDataV>).fNAlloc = 0;
  lVar1 = 0x578;
  do {
    MaterialDataV::~MaterialDataV
              ((MaterialDataV *)
               ((long)this->fExtAlloc[0].fProperties.super_TPZManVector<double,_10>.fExtAlloc +
               lVar1 + -0x68));
    lVar1 = lVar1 + -0x98;
  } while (lVar1 != -0x78);
  TPZVec<MaterialDataV>::~TPZVec(&this->super_TPZVec<MaterialDataV>);
  return;
}

Assistant:

TPZManVector< T, NumExtAlloc >::~TPZManVector() {
    if (this->fStore == fExtAlloc) {
        this->fStore = nullptr;
    }
    this->fNAlloc = 0;
}